

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_muladd(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,
                      mbedtls_ecp_point *P,mbedtls_mpi *n,mbedtls_ecp_point *Q)

{
  ecp_curve_type eVar1;
  undefined1 local_90 [8];
  mbedtls_ecp_point mP;
  int ret;
  mbedtls_ecp_point *Q_local;
  mbedtls_mpi *n_local;
  mbedtls_ecp_point *P_local;
  mbedtls_mpi *m_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  eVar1 = ecp_get_type(grp);
  if (eVar1 == ECP_TYPE_SHORT_WEIERSTRASS) {
    mbedtls_ecp_point_init((mbedtls_ecp_point *)local_90);
    mP.Z.p._4_4_ = mbedtls_ecp_mul_shortcuts(grp,(mbedtls_ecp_point *)local_90,m,P);
    if (((mP.Z.p._4_4_ == 0) &&
        (mP.Z.p._4_4_ = mbedtls_ecp_mul_shortcuts(grp,R,n,Q), mP.Z.p._4_4_ == 0)) &&
       (mP.Z.p._4_4_ = ecp_add_mixed(grp,R,(mbedtls_ecp_point *)local_90,R), mP.Z.p._4_4_ == 0)) {
      mP.Z.p._4_4_ = ecp_normalize_jac(grp,R);
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)local_90);
    grp_local._4_4_ = mP.Z.p._4_4_;
  }
  else {
    grp_local._4_4_ = -0x4e80;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecp_muladd( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             const mbedtls_mpi *n, const mbedtls_ecp_point *Q )
{
    int ret;
    mbedtls_ecp_point mP;

    if( ecp_get_type( grp ) != ECP_TYPE_SHORT_WEIERSTRASS )
        return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

    mbedtls_ecp_point_init( &mP );

    MBEDTLS_MPI_CHK( mbedtls_ecp_mul_shortcuts( grp, &mP, m, P ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul_shortcuts( grp, R,   n, Q ) );

    MBEDTLS_MPI_CHK( ecp_add_mixed( grp, R, &mP, R ) );
    MBEDTLS_MPI_CHK( ecp_normalize_jac( grp, R ) );

cleanup:
    mbedtls_ecp_point_free( &mP );

    return( ret );
}